

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

bool __thiscall Operand::operator==(Operand *this,Operand *other)

{
  size_t __n;
  int iVar1;
  
  if (((this->type == other->type) && (this->reg_num == other->reg_num)) &&
     (__n = (this->value)._M_string_length, __n == (other->value)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((this->value)._M_dataplus._M_p,(other->value)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const Operand& other) const {
		return type == other.type && reg_num == other.reg_num && value == other.value;
	}